

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O3

void testimages(wins *wins_ar,int ar_len)

{
  long *plVar1;
  char cVar2;
  char *pcVar3;
  undefined8 uVar4;
  long lVar5;
  Am_Image_Array kling;
  Am_Image_Array entd;
  Am_Image_Array ent;
  Am_Image_Array bogus;
  Am_Image_Array amulet;
  
  if (0 < ar_len) {
    lVar5 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->d4 + lVar5);
      pcVar3 = (char *)Am_Merge_Pathname("images/ent.xbm");
      Am_Image_Array::Am_Image_Array(&ent,pcVar3);
      cVar2 = Am_Image_Array::Valid();
      if (cVar2 == '\0') {
LAB_00104f00:
        Am_Error("ent bitmap not found");
LAB_00104f0c:
        uVar4 = Am_Error("Amulet gif file not found");
        Am_Image_Array::~Am_Image_Array(&kling);
        Am_Image_Array::~Am_Image_Array(&entd);
        Am_Image_Array::~Am_Image_Array(&ent);
        _Unwind_Resume(uVar4);
      }
      (**(code **)(*plVar1 + 0x138))
                (plVar1,0xa0,0xf,0xffffffff,0xffffffff,&ent,0,0,&Am_Purple,&Am_White,0,0);
      (**(code **)(*plVar1 + 0xa0))(plVar1);
      pcVar3 = (char *)Am_Merge_Pathname("images/ent_d.xbm");
      Am_Image_Array::Am_Image_Array(&entd,pcVar3);
      cVar2 = Am_Image_Array::Valid();
      if (cVar2 == '\0') {
LAB_00104ef4:
        Am_Error("entd bitmap not found");
        goto LAB_00104f00;
      }
      (**(code **)(*plVar1 + 0x138))
                (plVar1,0xa0,0x37,0xffffffff,0xffffffff,&entd,0,0,&Am_Black,&Am_No_Style,0,0);
      pcVar3 = (char *)Am_Merge_Pathname("images/kling.xbm");
      Am_Image_Array::Am_Image_Array(&kling,pcVar3);
      cVar2 = Am_Image_Array::Valid();
      if (cVar2 == '\0') {
        Am_Error("kling bitmap not found");
        goto LAB_00104ef4;
      }
      (**(code **)(*plVar1 + 0x138))
                (plVar1,0xa0,0x5f,0xffffffff,0xffffffff,&kling,0,0,&Am_Red,&Am_White,0,0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"testbits: Testing bogus GIF file name.",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      Am_Image_Array::Am_Image_Array(&bogus,"bogus_file.gif");
      pcVar3 = (char *)Am_Merge_Pathname("images/Am_med.gif");
      Am_Image_Array::Am_Image_Array(&amulet,pcVar3);
      cVar2 = Am_Image_Array::Valid();
      if (cVar2 == '\0') goto LAB_00104f0c;
      (**(code **)(*plVar1 + 0x138))
                (plVar1,0xf,0xf,0xffffffff,0xffffffff,&amulet,0,0,&Am_Black,&Am_White,0,0);
      Am_Image_Array::~Am_Image_Array(&amulet);
      Am_Image_Array::~Am_Image_Array(&bogus);
      Am_Image_Array::~Am_Image_Array(&kling);
      Am_Image_Array::~Am_Image_Array(&entd);
      Am_Image_Array::~Am_Image_Array(&ent);
      lVar5 = lVar5 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar5);
  }
  return;
}

Assistant:

void
testimages(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d4;

    Am_Image_Array ent(Am_Merge_Pathname(IMFN_ENT));

    if (!ent.Valid())
      Am_Error("ent bitmap not found");
    d->Draw_Image(160, 15, -1, -1, ent, 0, 0, Am_Purple, Am_White);
    d->Flush_Output();

    Am_Image_Array entd(Am_Merge_Pathname(IMFN_ENT_D));
    if (!entd.Valid())
      Am_Error("entd bitmap not found");
    d->Draw_Image(160, 55, -1, -1, entd, 0, 0, Am_Black, Am_No_Style);

    Am_Image_Array kling(Am_Merge_Pathname(IMFN_KLING));
    if (!kling.Valid())
      Am_Error("kling bitmap not found");
    d->Draw_Image(160, 95, -1, -1, kling, 0, 0, Am_Red, Am_White);

    std::cerr << "testbits: Testing bogus GIF file name." << std::endl;
    Am_Image_Array bogus("bogus_file.gif");

    Am_Image_Array amulet(Am_Merge_Pathname(AMULET_GIF));
    if (!amulet.Valid())
      Am_Error("Amulet gif file not found");
    d->Draw_Image(15, 15, -1, -1, amulet, 0, 0, Am_Black, Am_White);
    // the bg/fg styles shouldn't matter
  }
}